

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_isonumber.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  undefined **ppuVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  _Bool _Var10;
  long local_60 [6];
  
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_str_from_isonumber_u64");
  for (uVar6 = 1; uVar6 < 0x41; uVar6 = uVar6 << 2) {
    puVar3 = &test_str_from_isonumber_u64_results;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      for (lVar8 = 0; lVar8 != 0x28; lVar8 = lVar8 + 8) {
        lVar9 = *(long *)((long)&test_str_from_isonumber_u64_tests + lVar8) + lVar7 + -1;
        _Var10 = false;
        pcVar4 = (char *)isonumber_from_u64(local_60,lVar9 * uVar6,0,uVar6,0);
        if (pcVar4 != (char *)0x0) {
          iVar2 = strcmp(pcVar4,*(char **)((long)puVar3 + lVar8));
          _Var10 = iVar2 == 0;
        }
        cunit_named_check(pcVar4 != (char *)0x0,"test_str_from_isonumber_u64",0x53,
                          "isonumber_from_u64(%lu) is not null",lVar9);
        cunit_named_check(_Var10,"test_str_from_isonumber_u64",0x55,
                          "isonumber_from_u64(%lu) = %s should be %s",lVar9,pcVar4,
                          *(undefined8 *)((long)puVar3 + lVar8));
      }
      puVar3 = puVar3 + 5;
    }
  }
  cunit_end_test("test_str_from_isonumber_u64");
  cunit_start_test("test_isonumber_to_u64_to_string");
  for (uVar6 = 1; uVar6 < 0x41; uVar6 = uVar6 << 2) {
    for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 8) {
      local_60[0] = 0;
      uVar1 = *(undefined8 *)((long)&test_isonumber_to_u64_to_string_tests + lVar7);
      iVar2 = isonumber_to_u64(local_60,uVar1,uVar6);
      cunit_named_check(iVar2 == 0,"test_isonumber_to_u64_to_string",0x6f,
                        "isonumber_to_u64(\"%s\") failed");
      if (iVar2 == 0) {
        lVar8 = *(long *)((long)&test_isonumber_to_u64_to_string_results + lVar7) * uVar6;
        cunit_named_check(local_60[0] == lVar8,"test_isonumber_to_u64_to_string",0x72,
                          "isonumber_to_u64(\"%s\") != %lu (was %lu)",uVar1,lVar8,local_60[0]);
      }
    }
  }
  cunit_end_test("test_isonumber_to_u64_to_string");
  cunit_start_test("test_str_from_isonumber_s64");
  ppuVar5 = &test_str_from_isonumber_s64_results;
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    for (lVar8 = 0; lVar8 != 0x28; lVar8 = lVar8 + 8) {
      lVar9 = (*(long *)((long)&test_str_from_isonumber_s64_tests + lVar8) - lVar7) + 1;
      _Var10 = false;
      pcVar4 = (char *)isonumber_from_s64(local_60,lVar9,0,1,0);
      if (pcVar4 != (char *)0x0) {
        iVar2 = strcmp(pcVar4,*(char **)((long)ppuVar5 + lVar8));
        _Var10 = iVar2 == 0;
      }
      cunit_named_check(pcVar4 != (char *)0x0,"test_str_from_isonumber_s64",0xae,
                        "str_to_isonumber_s64(%ld) is not null",lVar9);
      cunit_named_check(_Var10,"test_str_from_isonumber_s64",0xb1,
                        "str_to_isonumber_s64(%ld) = %s should be %s",lVar9,pcVar4,
                        *(undefined8 *)((long)ppuVar5 + lVar8));
    }
    ppuVar5 = ppuVar5 + 5;
  }
  cunit_end_test("test_str_from_isonumber_s64");
  cunit_start_test("test_isonumber_to_s64_to_string");
  for (lVar7 = 0; lVar7 != 0x50; lVar7 = lVar7 + 8) {
    local_60[0] = 0;
    uVar1 = *(undefined8 *)((long)&test_isonumber_to_s64_to_string_tests + lVar7);
    iVar2 = isonumber_to_s64(local_60,uVar1,1);
    cunit_named_check(iVar2 == 0,"test_isonumber_to_s64_to_string",0x8e,
                      "isonumber_to_u64(\"%s\") failed");
    if (iVar2 == 0) {
      cunit_named_check(local_60[0] ==
                        *(long *)((long)&test_isonumber_to_s64_to_string_results + lVar7),
                        "test_isonumber_to_s64_to_string",0x91,
                        "isonumber_to_u64(\"%s\") != %ld (was %ld)",uVar1,
                        *(long *)((long)&test_isonumber_to_s64_to_string_results + lVar7),
                        local_60[0]);
    }
  }
  cunit_end_test("test_isonumber_to_s64_to_string");
  cunit_start_test("test_str_from_isonumber_s64_2");
  lVar7 = isonumber_from_s64(local_60,0x47f5000000000000,"bit/s",1,0);
  cunit_named_check(lVar7 != 0,"test_str_from_isonumber_s64_2",0xbf,"test");
  cunit_end_test("test_str_from_isonumber_s64_2");
  iVar2 = FINISH_TESTING();
  return iVar2;
}

Assistant:

int
main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  test_str_from_isonumber_u64();
  test_isonumber_to_u64_to_string();

  test_str_from_isonumber_s64();
  test_isonumber_to_s64_to_string();
  test_str_from_isonumber_s64_2();

  return FINISH_TESTING();
}